

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

int __thiscall bdQuery::addClosestPeer(bdQuery *this,bdId *id,uint32_t mode)

{
  bdDhtFunctions *pbVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined4 uVar5;
  bdId *pbVar6;
  bool bVar7;
  uint uVar8;
  time_t tVar9;
  pointer ppVar10;
  size_type sVar11;
  pair<bdMetric,_bdPeer> local_1a8;
  undefined1 local_148 [8];
  bdPeer peer;
  _Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_> local_e0;
  iterator it_1;
  bool hasReply_1;
  bool hasSent_1;
  time_t sendts_1;
  _Base_ptr local_b0;
  int local_a4;
  _Self _Stack_a0;
  int j;
  _Base_ptr local_98;
  undefined1 local_8a;
  byte local_89;
  bool hasReply;
  long lStack_88;
  bool hasSent;
  time_t sendts;
  int local_74;
  int local_70;
  int toDrop;
  int actualCloser;
  int i;
  _Base_ptr local_60;
  _Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_> local_58;
  iterator eit;
  iterator sit;
  iterator it;
  time_t ts;
  bdMetric dist;
  uint32_t mode_local;
  bdId *id_local;
  bdQuery *this_local;
  
  dist.super_bdNodeId.data._12_4_ = mode;
  unique0x100006df = id;
  tVar9 = time((time_t *)0x0);
  (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,&stack0xffffffffffffffe0->id,&ts);
  std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::_Rb_tree_iterator(&sit);
  std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::_Rb_tree_iterator(&eit);
  std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::_Rb_tree_iterator(&local_58);
  local_60 = (_Base_ptr)
             std::
             multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
             ::lower_bound(&this->mClosest,(key_type *)&ts);
  eit._M_node = local_60;
  _actualCloser =
       std::
       multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
       ::upper_bound(&this->mClosest,(key_type *)&ts);
  toDrop = 0;
  local_70 = 0;
  local_74 = 0;
  local_58._M_node = _actualCloser;
  sendts = (time_t)std::
                   multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                   ::begin(&this->mClosest);
  sit = (iterator)sendts;
  while (bVar7 = std::operator!=(&sit,&local_58), bVar7) {
    ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
    lStack_88 = tVar9 - (ppVar10->second).mLastSendTime;
    ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
    local_89 = (ppVar10->second).mLastSendTime != 0;
    ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
    lVar2 = (ppVar10->second).mLastRecvTime;
    ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
    local_8a = (ppVar10->second).mLastSendTime <= lVar2;
    if ((((local_89 & 1) != 0) && (!(bool)local_8a)) && (10 < lStack_88)) {
      toDrop = toDrop + -1;
      local_74 = local_74 + 1;
    }
    local_98 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator++(&sit,0);
    toDrop = toDrop + 1;
    local_70 = local_70 + 1;
  }
  if (this->mClosestListSize + -1 < toDrop) {
    this_local._4_4_ = 0;
  }
  else {
    sit = eit;
    while (bVar7 = std::operator!=(&sit,&local_58), pbVar6 = stack0xffffffffffffffe0, bVar7) {
      pbVar1 = this->mFns;
      ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
      uVar8 = (*pbVar1->_vptr_bdDhtFunctions[7])(pbVar1,pbVar6,&ppVar10->second);
      if ((uVar8 & 1) != 0) {
        if (dist.super_bdNodeId.data._12_4_ != 0) {
          pbVar1 = this->mFns;
          ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
          uVar8 = (*pbVar1->_vptr_bdDhtFunctions[8])
                            (pbVar1,&ppVar10->second,stack0xffffffffffffffe0);
          if ((uVar8 & 1) != 0) {
            ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
            (ppVar10->second).mExtraFlags = (ppVar10->second).mExtraFlags | 1;
          }
        }
        if ((dist.super_bdNodeId.data._12_4_ & 4) != 0) {
          ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
          uVar5 = dist.super_bdNodeId.data._12_4_;
          (ppVar10->second).mLastRecvTime = tVar9;
          ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
          (ppVar10->second).mPeerFlags = uVar5 | (ppVar10->second).mPeerFlags;
        }
        return 1;
      }
      _Stack_a0 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator++(&sit,0);
      toDrop = toDrop + 1;
    }
    for (local_a4 = 0; local_a4 < local_74; local_a4 = local_a4 + 1) {
      local_b0 = (_Base_ptr)
                 std::
                 multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                 ::begin(&this->mClosest);
      sit = (iterator)local_b0;
      while( true ) {
        sendts_1 = (time_t)std::
                           multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                           ::end(&this->mClosest);
        bVar7 = std::operator!=(&sit,(_Self *)&sendts_1);
        if (!bVar7) break;
        ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
        lVar2 = (ppVar10->second).mLastSendTime;
        ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
        lVar3 = (ppVar10->second).mLastSendTime;
        ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
        lVar4 = (ppVar10->second).mLastRecvTime;
        ppVar10 = std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator->(&sit);
        if (((lVar3 != 0) && (lVar4 < (ppVar10->second).mLastSendTime)) && (10 < tVar9 - lVar2)) {
          it_1 = std::
                 multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                 ::erase_abi_cxx11_((multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                                     *)&this->mClosest,sit);
          break;
        }
        std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator++(&sit);
      }
    }
    while (sVar11 = std::
                    multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
                    ::size(&this->mClosest), this->mClosestListSize - 1 < sVar11) {
      std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::_Rb_tree_iterator(&local_e0);
      local_e0._M_node =
           (_Base_ptr)
           std::
           multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
           ::end(&this->mClosest);
      bVar7 = std::
              multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
              ::empty(&this->mClosest);
      if (!bVar7) {
        std::_Rb_tree_iterator<std::pair<const_bdMetric,_bdPeer>_>::operator--(&local_e0,0);
        peer._64_8_ = std::
                      multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                      ::erase_abi_cxx11_((multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                                          *)&this->mClosest,(iterator)local_e0._M_node);
      }
    }
    bdPeer::bdPeer((bdPeer *)local_148);
    memcpy(local_148,stack0xffffffffffffffe0,0x24);
    peer.mPeerId.id.data[0xc] = dist.super_bdNodeId.data[0xc];
    peer.mPeerId.id.data[0xd] = dist.super_bdNodeId.data[0xd];
    peer.mPeerId.id.data[0xe] = dist.super_bdNodeId.data[0xe];
    peer.mPeerId.id.data[0xf] = dist.super_bdNodeId.data[0xf];
    peer.mPeerId.id.data[0x10] = '\0';
    peer.mPeerId.id.data[0x11] = '\0';
    peer.mPeerId.id.data[0x12] = '\0';
    peer.mPeerId.id.data[0x13] = '\0';
    peer.mPeerFlags = 0;
    peer.mLastSendTime = 0;
    if ((dist.super_bdNodeId.data._12_4_ & 4) != 0) {
      peer.mLastSendTime = tVar9;
    }
    peer.mLastRecvTime = tVar9;
    std::pair<bdMetric,_bdPeer>::pair<bdMetric_&,_bdPeer_&,_true>
              (&local_1a8,(bdMetric *)&ts,(bdPeer *)local_148);
    std::
    multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>::
    insert<std::pair<bdMetric,bdPeer>>
              ((multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                *)&this->mClosest,&local_1a8);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int bdQuery::addClosestPeer(const bdId *id, uint32_t mode) {
	bdMetric dist;
	time_t ts = time(NULL);

	mFns->bdDistance(&mId, &(id->id), &dist);

#ifdef DEBUG_QUERY 
        fprintf(stderr, "bdQuery::addPeer(");
	mFns->bdPrintId(std::cerr, id);
        fprintf(stderr, ", %u)\n", mode);
#endif

	std::multimap<bdMetric, bdPeer>::iterator it, sit, eit;
	sit = mClosest.lower_bound(dist);
	eit = mClosest.upper_bound(dist);
	int i = 0;
	int actualCloser = 0;
	int toDrop = 0;
	// switched end condition to upper_bound to provide stability for NATTED peers.
	// we will favour the older entries!
	for (it = mClosest.begin(); it != eit; it++, i++, actualCloser++) {
		time_t sendts = ts - it->second.mLastSendTime;
		bool hasSent = (it->second.mLastSendTime != 0);
		bool hasReply = (it->second.mLastRecvTime >= it->second.mLastSendTime);
		if ((hasSent) && (!hasReply) && (sendts > EXPECTED_REPLY)) {
			i--; /* dont count this one */
			toDrop++;
		}
	}
		// Counts where we are.
#ifdef DEBUG_QUERY 
        fprintf(stderr, "Searching.... %di = %d - %d peers closer than this one\n", i, actualCloser, toDrop);
#endif


	if (i > mClosestListSize - 1) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "Distance to far... dropping\n");
#endif
		/* drop it */
		return 0;
	}

	for (it = sit; it != eit; it++, i++) {
		/* full id check */
		if (mFns->bdSimilarId(id, &(it->second.mPeerId))) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "Peer Already here!\n");
#endif
			if (mode) {
				/* also update port from incoming id, as we have definitely recved from it */
				if (mFns->bdUpdateSimilarId(&(it->second.mPeerId), id))
					/* updated it... must be Unstable */
					it->second.mExtraFlags |= BITDHT_PEER_EXFLAG_UNSTABLE;
			}
			if (mode & BITDHT_PEER_STATUS_RECV_NODES) {
				/* only update recvTime if sendTime > checkTime.... (then its our query) */
#ifdef DEBUG_QUERY 
				fprintf(stderr, "Updating LastRecvTime\n");
#endif
				it->second.mLastRecvTime = ts;
				it->second.mPeerFlags |= mode;
			}
			return 1;
		}
	}

#ifdef DEBUG_QUERY 
        fprintf(stderr, "Peer not in Query\n");
#endif
	/* firstly drop unresponded (bit ugly - but hard structure to extract from) */
	for (int j = 0; j < toDrop; j++) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "Dropping Peer that dont reply\n");
#endif
		for (it = mClosest.begin(); it != mClosest.end(); ++it) {
			time_t sendts = ts - it->second.mLastSendTime;
			bool hasSent = (it->second.mLastSendTime != 0);
			bool hasReply = (it->second.mLastRecvTime >= it->second.mLastSendTime);

			if ((hasSent) && (!hasReply) && (sendts > EXPECTED_REPLY)) {
#ifdef DEBUG_QUERY 
        			fprintf(stderr, "Dropped: ");
				mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
        			fprintf(stderr, "\n");
#endif
				mClosest.erase(it);
				break ;
			}
		}
	}

	/* trim it back */
	while (mClosest.size() > (uint32_t) (mClosestListSize - 1)) {
		std::multimap<bdMetric, bdPeer>::iterator it;
		it = mClosest.end();
		if (!mClosest.empty()) {
			it--;
#ifdef DEBUG_QUERY 
			fprintf(stderr, "Removing Furthest Peer: ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			fprintf(stderr, "\n");
#endif

			mClosest.erase(it);
		}
	}

#ifdef DEBUG_QUERY 
        fprintf(stderr, "bdQuery::addPeer(): Closer Peer!: ");
	mFns->bdPrintId(std::cerr, id);
        fprintf(stderr, "\n");
#endif

	/* add it in */
	bdPeer peer;
	peer.mPeerId = *id;
	peer.mPeerFlags = mode;
	peer.mLastSendTime = 0;
	peer.mLastRecvTime = 0;
	peer.mFoundTime = ts;

	if (mode & BITDHT_PEER_STATUS_RECV_NODES)
		peer.mLastRecvTime = ts;

	mClosest.insert(std::pair<bdMetric, bdPeer>(dist, peer));
	return 1;
}